

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64_test.cc
# Opt level: O2

void __thiscall
prometheus::anon_unknown_0::Base64Test_rejectInvalidPadding_Test::TestBody
          (Base64Test_rejectInvalidPadding_Test *this)

{
  bool bVar1;
  AssertHelper local_50;
  string local_48;
  string local_28;
  
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      ::std::__cxx11::string::string((string *)&local_48,"A===",(allocator *)&local_50);
      detail::base64_decode(&local_28,&local_48);
      ::std::__cxx11::string::~string((string *)&local_28);
      ::std::__cxx11::string::~string((string *)&local_48);
    }
  }
  testing::Message::Message((Message *)&local_48);
  testing::internal::AssertHelper::AssertHelper
            (&local_50,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/util/tests/unit/base64_test.cc"
             ,0x4a,
             "Expected: detail::base64_decode(\"A===\") throws an exception.\n  Actual: it doesn\'t."
            );
  testing::internal::AssertHelper::operator=(&local_50,(Message *)&local_48);
  testing::internal::AssertHelper::~AssertHelper(&local_50);
  if ((long *)local_48._M_dataplus._M_p != (long *)0x0) {
    (**(code **)(*(long *)local_48._M_dataplus._M_p + 8))();
  }
  return;
}

Assistant:

TEST(Base64Test, rejectInvalidPadding) {
  EXPECT_ANY_THROW(detail::base64_decode("A==="));
}